

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O1

void __thiscall
gtest_suite_NoiseModelUpdateTest_::
UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_short,_12,_true>_>::
~UpdateSuccessForZeroNoiseAllFlat
          (UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_short,_12,_true>_> *this)

{
  pointer puVar1;
  pointer pdVar2;
  pointer puVar3;
  
  (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_12,_true>_>).super_Test.
  _vptr_Test = (_func_int **)&PTR__NoiseModelUpdateTest_01052848;
  puVar1 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_12,_true>_>).
           flat_blocks_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pdVar2 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_12,_true>_>).renoise_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_12,_true>_>).noise_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  puVar3 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_12,_true>_>).denoised_.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  puVar3 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_12,_true>_>).data_.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, UpdateSuccessForZeroNoiseAllFlat) {
  this->flat_blocks_.assign(this->flat_blocks_.size(), 1);
  this->denoised_.assign(this->denoised_.size(), 128);
  this->data_.assign(this->denoised_.size(), 128);
  EXPECT_EQ(AOM_NOISE_STATUS_INTERNAL_ERROR, this->NoiseModelUpdate());
}